

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::truncSatToUI64(Literal *__return_storage_ptr__,Literal *this)

{
  bool bVar1;
  int32_t val;
  int64_t val_00;
  Literal local_90;
  Literal local_78;
  BasicType local_60 [4];
  Literal local_50;
  Literal local_38;
  BasicType local_1c;
  Literal *local_18;
  Literal *this_local;
  
  local_1c = f32;
  local_18 = this;
  this_local = __return_storage_ptr__;
  bVar1 = wasm::Type::operator==(&this->type,&local_1c);
  if (bVar1) {
    Literal(&local_50,this);
    castToI32(&local_38,&local_50);
    val = geti32(&local_38);
    saturating_trunc<float,_unsigned_long,_&wasm::isInRangeI64TruncU>(__return_storage_ptr__,val);
    ~Literal(&local_38);
    ~Literal(&local_50);
  }
  else {
    local_60[0] = f64;
    bVar1 = wasm::Type::operator==(&this->type,local_60);
    if (!bVar1) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x338);
    }
    Literal(&local_90,this);
    castToI64(&local_78,&local_90);
    val_00 = geti64(&local_78);
    saturating_trunc<double,_unsigned_long,_&wasm::isInRangeI64TruncU>
              (__return_storage_ptr__,val_00);
    ~Literal(&local_78);
    ~Literal(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncSatToUI64() const {
  if (type == Type::f32) {
    return saturating_trunc<float, uint64_t, isInRangeI64TruncU>(
      Literal(*this).castToI32().geti32());
  }
  if (type == Type::f64) {
    return saturating_trunc<double, uint64_t, isInRangeI64TruncU>(
      Literal(*this).castToI64().geti64());
  }
  WASM_UNREACHABLE("invalid type");
}